

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O1

void __thiscall
Qentem::QTest::IsNotEqual<Qentem::String<char>,char[3]>
          (QTest *this,String<char> *left,char (*right) [3],unsigned_long line)

{
  long lVar1;
  SizeT SVar2;
  ulong uVar3;
  bool bVar4;
  
  if ((this->error_ != true) || (this->continue_on_error_ == true)) {
    if ((*right)[0] == '\0') {
      SVar2 = 0;
    }
    else {
      bVar4 = false;
      uVar3 = 0;
      if ((*right)[0] == *left->storage_) {
        uVar3 = 0;
        do {
          lVar1 = uVar3 + 1;
          bVar4 = (*right)[lVar1] == '\0';
          if (bVar4) {
            SVar2 = (int)uVar3 + 1;
            goto LAB_001042c6;
          }
          uVar3 = uVar3 + 1;
        } while ((*right)[lVar1] == left->storage_[uVar3 & 0xffffffff]);
      }
      SVar2 = (SizeT)uVar3;
      if (!bVar4) {
        return;
      }
    }
LAB_001042c6:
    if (left->length_ == SVar2) {
      this->error_ = true;
      PrintErrorMessage<Qentem::String<char>,char[3]>(this,true,left,right,line);
      return;
    }
  }
  return;
}

Assistant:

QENTEM_NOINLINE void IsNotEqual(const Value1_T &left, const Value2_T &right, unsigned long line) {
        if ((!error_ || continue_on_error_) && (left == right)) {
            error_ = true;
            QTest::PrintErrorMessage(true, left, right, line);
        }
    }